

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_fixed_point.cpp
# Opt level: O2

Convergence_Data * __thiscall
Disa::Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data>::solve_system
          (Convergence_Data *__return_storage_ptr__,
          Solver_Fixed_Point<(Disa::Solver_Type)3,_Disa::Solver_Fixed_Point_Sor_Data> *this,
          Matrix_Sparse *a_matrix,Vector_Dense<double,_0UL> *x_vector,
          Vector_Dense<double,_0UL> *b_vector)

{
  bool bVar1;
  
  __return_storage_ptr__->residual_max_0 = 0.0;
  __return_storage_ptr__->residual_max_normalised = 0.0;
  __return_storage_ptr__->residual_normalised = 0.0;
  __return_storage_ptr__->residual_max = 0.0;
  __return_storage_ptr__->residual = 0.0;
  __return_storage_ptr__->residual_0 = 0.0;
  (__return_storage_ptr__->start_time).__d.__r = 0;
  __return_storage_ptr__->iteration = 0;
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->duration).__r = 0;
  Convergence_Data::Convergence_Data(__return_storage_ptr__);
  while( true ) {
    bVar1 = Convergence_Criteria::is_converged((Convergence_Criteria *)this,__return_storage_ptr__);
    if (bVar1) break;
    forward_sweep(a_matrix,x_vector,x_vector,b_vector,1.5);
    Convergence_Data::update<Disa::Matrix_Sparse,Disa::Vector_Dense<double,0ul>>
              (__return_storage_ptr__,a_matrix,x_vector,b_vector);
  }
  return __return_storage_ptr__;
}

Assistant:

Convergence_Data Solver_Fixed_Point<Solver_Type::successive_over_relaxation, Solver_Fixed_Point_Sor_Data>::solve_system(
const Matrix_Sparse& a_matrix, Vector_Dense<Scalar, 0>& x_vector, const Vector_Dense<Scalar, 0>& b_vector) {
  Convergence_Data convergence_data = Convergence_Data();
  while(!data.limits.is_converged(convergence_data)) {
    forward_sweep(a_matrix, x_vector, x_vector, b_vector, 1.5);
    convergence_data.update(a_matrix, x_vector, b_vector);
  }

  return convergence_data;
}